

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O3

void __thiscall JtagAnalyzer::WorkerThread(JtagAnalyzer *this)

{
  JtagTAPState JVar1;
  JtagAnalyzerResults *pJVar2;
  bool bVar3;
  int iVar4;
  MarkerType MVar5;
  BitState tms_state;
  U64 UVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  JtagShiftedData shifted_data;
  uchar local_b1;
  JtagShiftedData local_b0;
  Channel *local_78;
  Channel *local_70;
  Channel *local_68;
  Channel *local_60;
  U64 local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined1 local_37;
  
  Setup(this);
  if (this->mTrst != (AnalyzerChannelData *)0x0) {
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      (this->mTAPCtrl).mCurrTAPState = TestLogicReset;
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar6 = AnalyzerChannelData::GetSampleNumber();
      SyncToSample(this,UVar6);
      goto LAB_00108502;
    }
  }
  (this->mTAPCtrl).mCurrTAPState = (this->mSettings).mTAPInitialState;
LAB_00108502:
  Frame::Frame((Frame *)local_58);
  local_58[0] = AnalyzerChannelData::GetSampleNumber();
  local_38 = (undefined1)(this->mTAPCtrl).mCurrTAPState;
  local_37 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_60 = &(this->mSettings).mTckChannel;
  local_70 = &(this->mSettings).mTdiChannel;
  local_78 = &(this->mSettings).mTdoChannel;
  local_68 = &(this->mSettings).mTmsChannel;
  do {
    AdvanceTck(this,(Frame *)local_58,&local_b0);
    iVar4 = AnalyzerChannelData::GetBitState();
    if (iVar4 == 0) {
      AdvanceTck(this,(Frame *)local_58,&local_b0);
    }
    UVar6 = AnalyzerChannelData::GetSampleNumber();
    SyncToSample(this,UVar6);
    pJVar2 = (this->mResults)._M_ptr;
    MVar5 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pJVar2,MVar5,(Channel *)0x4);
    JVar1 = (this->mTAPCtrl).mCurrTAPState;
    if ((JVar1 == ShiftIR) || (JVar1 == ShiftDR)) {
      if (this->mTdi == (AnalyzerChannelData *)0x0) {
        uVar7 = 0;
      }
      else {
        pJVar2 = (this->mResults)._M_ptr;
        MVar5 = AnalyzerChannelData::GetSampleNumber();
        iVar4 = AnalyzerChannelData::GetBitState();
        AnalyzerResults::AddMarker((ulonglong)pJVar2,MVar5,(Channel *)(ulong)(iVar4 == 1 ^ 0xb));
        local_b1 = AnalyzerChannelData::GetBitState();
        if (local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_b0.mTdiBits,
                     (iterator)
                     local_b0.mTdiBits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b1);
        }
        else {
          *local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_b1;
          local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_b0.mTdiBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = (long)local_b0.mTdiBits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b0.mTdiBits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      if (this->mTdo != (AnalyzerChannelData *)0x0) {
        pJVar2 = (this->mResults)._M_ptr;
        MVar5 = AnalyzerChannelData::GetSampleNumber();
        iVar4 = AnalyzerChannelData::GetBitState();
        AnalyzerResults::AddMarker((ulonglong)pJVar2,MVar5,(Channel *)(ulong)(iVar4 == 1 ^ 0xb));
        local_b1 = AnalyzerChannelData::GetBitState();
        if (local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_b0.mTdoBits,
                     (iterator)
                     local_b0.mTdoBits.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b1);
        }
        else {
          *local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_b1;
          local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_b0.mTdoBits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = (long)local_b0.mTdoBits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_b0.mTdoBits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
      }
      uVar9 = (ulong)(this->mSettings).mShiftDRBitsPerDataUnit;
      if ((uVar9 != 0) && (uVar9 <= uVar7)) {
        UVar6 = AnalyzerChannelData::GetSampleNumber();
        CloseFrameV2(this,(Frame *)local_58,&local_b0,UVar6);
        lVar8 = AnalyzerChannelData::GetSampleNumber();
        local_b0.mStartSampleIndex = lVar8 + 1;
        local_38 = (undefined1)(this->mTAPCtrl).mCurrTAPState;
        local_58[0] = local_b0.mStartSampleIndex;
        AnalyzerResults::CommitResults();
      }
    }
    tms_state = AnalyzerChannelData::GetBitState();
    bVar3 = JtagTAP_Controller::AdvanceState(&this->mTAPCtrl,tms_state);
    if (bVar3) {
      pJVar2 = (this->mResults)._M_ptr;
      MVar5 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pJVar2,MVar5,(Channel *)0x0);
      UVar6 = AnalyzerChannelData::GetSampleNumber();
      CloseFrameV2(this,(Frame *)local_58,&local_b0,UVar6);
      lVar8 = AnalyzerChannelData::GetSampleNumber();
      local_b0.mStartSampleIndex = lVar8 + 1;
      local_38 = (undefined1)(this->mTAPCtrl).mCurrTAPState;
      local_58[0] = local_b0.mStartSampleIndex;
      AnalyzerResults::CommitResults();
    }
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
  } while( true );
}

Assistant:

void JtagAnalyzer::WorkerThread()
{
    Setup();

    // make sure that we enter the loop on TRST high (inactive)
    if( mTrst != NULL && mTrst->GetBitState() == BIT_LOW )
    {
        // since we started on a active TRST we'll
        // ignore the initial state from the settings
        mTAPCtrl.SetState( TestLogicReset );

        // advance to the rising edge of TRST
        mTrst->AdvanceToNextEdge();
        SyncToSample( mTrst->GetSampleNumber() );
    }
    else
    {
        mTAPCtrl.SetState( mSettings.mTAPInitialState );
    }

    Frame frm;
    frm.mStartingSampleInclusive = mTck->GetSampleNumber();
    frm.mType = mTAPCtrl.GetCurrState();
    frm.mFlags = 0;
    frm.mData1 = 0;
    frm.mData2 = 0;

    JtagShiftedData shifted_data;

    for( ;; )
    {
        // advance TCK to the rising edge
        AdvanceTck( frm, shifted_data );
        if( mTck->GetBitState() == BIT_LOW )
            AdvanceTck( frm, shifted_data );

        // advance all other channels here too
        SyncToSample( mTck->GetSampleNumber() );

        // mark the rising edge of TCK
        mResults->AddMarker( mTck->GetSampleNumber(), AnalyzerResults::UpArrow, mSettings.mTckChannel );

        // save TDI and TDO states markers and data
        if( mTAPCtrl.GetCurrState() == ShiftIR || mTAPCtrl.GetCurrState() == ShiftDR )
        {
            size_t bitCount = 0;

            if( mTdi != NULL )
            {
                mResults->AddMarker( mTdi->GetSampleNumber(),
                                     ( mTdi->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero ),
                                     mSettings.mTdiChannel );
                shifted_data.mTdiBits.push_back( mTdi->GetBitState() );
                bitCount = shifted_data.mTdiBits.size();
            }

            if( mTdo != NULL )
            {
                mResults->AddMarker( mTdo->GetSampleNumber(),
                                     ( mTdo->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero ),
                                     mSettings.mTdoChannel );
                shifted_data.mTdoBits.push_back( mTdo->GetBitState() );
                bitCount = shifted_data.mTdoBits.size();
            }

            if( ( mSettings.mShiftDRBitsPerDataUnit != 0 ) && ( bitCount >= mSettings.mShiftDRBitsPerDataUnit ) )
            {
                CloseFrameV2( frm, shifted_data, mTck->GetSampleNumber() );

                // prepare the next frame
                frm.mStartingSampleInclusive = mTck->GetSampleNumber() + 1;
                frm.mType = mTAPCtrl.GetCurrState();

                shifted_data.mStartSampleIndex = frm.mStartingSampleInclusive;

                mResults->CommitResults();
            }
        }

        // send TMS state to the TAP state machine - returns true if state machine has changed
        if( mTAPCtrl.AdvanceState( mTms->GetBitState() ) )
        {
            mResults->AddMarker( mTms->GetSampleNumber(), AnalyzerResults::Dot, mSettings.mTmsChannel );

            CloseFrameV2( frm, shifted_data, mTck->GetSampleNumber() );

            // prepare the next frame
            frm.mStartingSampleInclusive = mTck->GetSampleNumber() + 1;
            frm.mType = mTAPCtrl.GetCurrState();

            shifted_data.mStartSampleIndex = frm.mStartingSampleInclusive;

            mResults->CommitResults();
        }

        // update progress bar
        ReportProgress( mTck->GetSampleNumber() );
    }
}